

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itread.c
# Opt level: O3

int decompress16(DUMBFILE *f,short *data,int len,int it215,int stereo)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  short sVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int extraout_EAX;
  ulong in_RAX;
  long lVar14;
  ulong extraout_RAX;
  uint uVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  uint bitwidth;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  byte bVar25;
  bool bVar27;
  undefined1 auVar28 [16];
  int iVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  int iVar40;
  int iVar45;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  int iVar46;
  int iVar48;
  undefined1 auVar47 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar51 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  uint uVar26;
  
  auVar8 = _DAT_005d6f70;
  auVar7 = _DAT_005d6f60;
  auVar6 = _DAT_005d6f50;
  auVar5 = _DAT_005d6240;
  auVar4 = _DAT_005d6230;
  local_48 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  if (0 < len) {
    lVar14 = (long)(stereo + 1);
    lVar16 = (ulong)(uint)len - 1;
    auVar28._8_4_ = (int)lVar16;
    auVar28._0_8_ = lVar16;
    auVar28._12_4_ = (int)((ulong)lVar16 >> 0x20);
    lVar17 = lVar14 * 2;
    lVar21 = lVar14 * 0x10;
    lVar22 = lVar14 * -2;
    lVar16 = lVar14 * 4;
    lVar23 = lVar14 * 0xc;
    lVar24 = lVar14 * 10;
    in_RAX = lVar14 << 3;
    lVar14 = lVar14 * 6;
    lVar20 = 0;
    auVar28 = auVar28 ^ _DAT_005d6240;
    uVar19 = 0;
    do {
      lVar22 = lVar21 + lVar22;
      auVar39._8_4_ = (int)uVar19;
      auVar39._0_8_ = uVar19;
      auVar39._12_4_ = (int)(uVar19 >> 0x20);
      auVar31 = (auVar39 | auVar4) ^ auVar5;
      iVar40 = auVar28._0_4_;
      iVar46 = -(uint)(iVar40 < auVar31._0_4_);
      iVar18 = auVar28._4_4_;
      auVar32._4_4_ = -(uint)(iVar18 < auVar31._4_4_);
      iVar45 = auVar28._8_4_;
      iVar48 = -(uint)(iVar45 < auVar31._8_4_);
      iVar29 = auVar28._12_4_;
      auVar32._12_4_ = -(uint)(iVar29 < auVar31._12_4_);
      auVar42._4_4_ = iVar46;
      auVar42._0_4_ = iVar46;
      auVar42._8_4_ = iVar48;
      auVar42._12_4_ = iVar48;
      auVar49 = pshuflw(in_XMM11,auVar42,0xe8);
      auVar34._4_4_ = -(uint)(auVar31._4_4_ == iVar18);
      auVar34._12_4_ = -(uint)(auVar31._12_4_ == iVar29);
      auVar34._0_4_ = auVar34._4_4_;
      auVar34._8_4_ = auVar34._12_4_;
      auVar51 = pshuflw(in_XMM12,auVar34,0xe8);
      auVar32._0_4_ = auVar32._4_4_;
      auVar32._8_4_ = auVar32._12_4_;
      auVar50 = pshuflw(auVar49,auVar32,0xe8);
      auVar31._8_4_ = 0xffffffff;
      auVar31._0_8_ = 0xffffffffffffffff;
      auVar31._12_4_ = 0xffffffff;
      auVar31 = (auVar50 | auVar51 & auVar49) ^ auVar31;
      auVar31 = packssdw(auVar31,auVar31);
      if ((auVar31 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)data + lVar20) = 0;
      }
      auVar32 = auVar34 & auVar42 | auVar32;
      auVar31 = packssdw(auVar32,auVar32);
      auVar50._8_4_ = 0xffffffff;
      auVar50._0_8_ = 0xffffffffffffffff;
      auVar50._12_4_ = 0xffffffff;
      auVar31 = packssdw(auVar31 ^ auVar50,auVar31 ^ auVar50);
      if ((auVar31._0_4_ >> 0x10 & 1) != 0) {
        *(undefined2 *)((long)data + lVar17) = 0;
      }
      auVar31 = (auVar39 | auVar8) ^ auVar5;
      iVar46 = -(uint)(iVar40 < auVar31._0_4_);
      auVar47._4_4_ = -(uint)(iVar18 < auVar31._4_4_);
      iVar48 = -(uint)(iVar45 < auVar31._8_4_);
      auVar47._12_4_ = -(uint)(iVar29 < auVar31._12_4_);
      auVar33._4_4_ = iVar46;
      auVar33._0_4_ = iVar46;
      auVar33._8_4_ = iVar48;
      auVar33._12_4_ = iVar48;
      auVar41._4_4_ = -(uint)(auVar31._4_4_ == iVar18);
      auVar41._12_4_ = -(uint)(auVar31._12_4_ == iVar29);
      auVar41._0_4_ = auVar41._4_4_;
      auVar41._8_4_ = auVar41._12_4_;
      auVar47._0_4_ = auVar47._4_4_;
      auVar47._8_4_ = auVar47._12_4_;
      auVar31 = auVar41 & auVar33 | auVar47;
      auVar31 = packssdw(auVar31,auVar31);
      auVar1._8_4_ = 0xffffffff;
      auVar1._0_8_ = 0xffffffffffffffff;
      auVar1._12_4_ = 0xffffffff;
      auVar31 = packssdw(auVar31 ^ auVar1,auVar31 ^ auVar1);
      if ((auVar31 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)data + lVar16) = 0;
      }
      auVar34 = pshufhw(auVar33,auVar33,0x84);
      auVar42 = pshufhw(auVar41,auVar41,0x84);
      auVar32 = pshufhw(auVar34,auVar47,0x84);
      auVar35._8_4_ = 0xffffffff;
      auVar35._0_8_ = 0xffffffffffffffff;
      auVar35._12_4_ = 0xffffffff;
      auVar35 = (auVar32 | auVar42 & auVar34) ^ auVar35;
      auVar34 = packssdw(auVar35,auVar35);
      if ((auVar34 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)data + lVar14) = 0;
      }
      auVar34 = (auVar39 | auVar7) ^ auVar5;
      iVar46 = -(uint)(iVar40 < auVar34._0_4_);
      auVar37._4_4_ = -(uint)(iVar18 < auVar34._4_4_);
      iVar48 = -(uint)(iVar45 < auVar34._8_4_);
      auVar37._12_4_ = -(uint)(iVar29 < auVar34._12_4_);
      auVar43._4_4_ = iVar46;
      auVar43._0_4_ = iVar46;
      auVar43._8_4_ = iVar48;
      auVar43._12_4_ = iVar48;
      auVar31 = pshuflw(auVar31,auVar43,0xe8);
      auVar36._4_4_ = -(uint)(auVar34._4_4_ == iVar18);
      auVar36._12_4_ = -(uint)(auVar34._12_4_ == iVar29);
      auVar36._0_4_ = auVar36._4_4_;
      auVar36._8_4_ = auVar36._12_4_;
      auVar34 = pshuflw(auVar51 & auVar49,auVar36,0xe8);
      in_XMM12 = auVar34 & auVar31;
      auVar37._0_4_ = auVar37._4_4_;
      auVar37._8_4_ = auVar37._12_4_;
      auVar31 = pshuflw(auVar31,auVar37,0xe8);
      auVar49._8_4_ = 0xffffffff;
      auVar49._0_8_ = 0xffffffffffffffff;
      auVar49._12_4_ = 0xffffffff;
      auVar49 = (auVar31 | in_XMM12) ^ auVar49;
      in_XMM11 = packssdw(auVar49,auVar49);
      if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)data + in_RAX) = 0;
      }
      auVar37 = auVar36 & auVar43 | auVar37;
      auVar31 = packssdw(auVar37,auVar37);
      auVar51._8_4_ = 0xffffffff;
      auVar51._0_8_ = 0xffffffffffffffff;
      auVar51._12_4_ = 0xffffffff;
      auVar31 = packssdw(auVar31 ^ auVar51,auVar31 ^ auVar51);
      if ((auVar31 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)data + lVar24) = 0;
      }
      auVar31 = (auVar39 | auVar6) ^ auVar5;
      iVar40 = -(uint)(iVar40 < auVar31._0_4_);
      auVar44._4_4_ = -(uint)(iVar18 < auVar31._4_4_);
      iVar45 = -(uint)(iVar45 < auVar31._8_4_);
      auVar44._12_4_ = -(uint)(iVar29 < auVar31._12_4_);
      auVar38._4_4_ = iVar40;
      auVar38._0_4_ = iVar40;
      auVar38._8_4_ = iVar45;
      auVar38._12_4_ = iVar45;
      auVar30._4_4_ = -(uint)(auVar31._4_4_ == iVar18);
      auVar30._12_4_ = -(uint)(auVar31._12_4_ == iVar29);
      auVar30._0_4_ = auVar30._4_4_;
      auVar30._8_4_ = auVar30._12_4_;
      auVar44._0_4_ = auVar44._4_4_;
      auVar44._8_4_ = auVar44._12_4_;
      auVar31 = auVar30 & auVar38 | auVar44;
      auVar31 = packssdw(auVar31,auVar31);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar31 = packssdw(auVar31 ^ auVar2,auVar31 ^ auVar2);
      if ((auVar31 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)data + lVar23) = 0;
      }
      auVar39 = pshufhw(auVar38,auVar38,0x84);
      auVar31 = pshufhw(auVar30,auVar30,0x84);
      auVar34 = pshufhw(auVar39,auVar44,0x84);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar31 = packssdw(auVar31 & auVar39,(auVar34 | auVar31 & auVar39) ^ auVar3);
      if ((auVar31 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)data + lVar22) = 0;
      }
      uVar19 = uVar19 + 8;
      lVar23 = lVar23 + lVar21;
      lVar24 = lVar24 + lVar21;
      in_RAX = in_RAX + lVar21;
      lVar14 = lVar14 + lVar21;
      lVar16 = lVar16 + lVar21;
      lVar17 = lVar17 + lVar21;
      lVar20 = lVar20 + lVar21;
    } while ((len + 7U & 0xfffffff8) != uVar19);
    if (0 < len) {
      do {
        uVar10 = readblock(f,(readblock_crap *)local_58);
        in_RAX = (ulong)uVar10;
        if (uVar10 != 0) break;
        uVar10 = 0x4000;
        if ((uint)len < 0x4000) {
          uVar10 = len;
        }
        uVar11 = len - uVar10;
        iVar40 = 0;
        uVar26 = 0x11;
        bVar27 = true;
        iVar18 = 0;
        uVar12 = 0;
        uVar13 = len;
        do {
          while( true ) {
            len = uVar13;
            bVar25 = (byte)uVar26;
            bitwidth = uVar26 & 0xff;
            uVar13 = readbits(bitwidth,(readblock_crap *)local_58);
            if (6 < bVar25) break;
            if (uVar13 != 1 << (bVar25 - 1 & 0x1f)) {
LAB_005b8307:
              uVar13 = (int)(short)(uVar13 << (0x10 - bVar25 & 0x1f)) >> (0x10 - bVar25 & 0x1f);
              goto LAB_005b8311;
            }
            iVar45 = readbits(4,(readblock_crap *)local_58);
            uVar26 = (uint)(byte)((char)iVar45 + 2);
            if ((int)(iVar45 + 1U) < (int)bitwidth) {
              uVar26 = iVar45 + 1U;
            }
LAB_005b82f5:
            uVar13 = len;
            if (!bVar27) goto LAB_005b8362;
          }
          if (0x10 < bVar25) {
            if (bVar25 != 0x11) {
              free((void *)local_58._0_8_);
              return extraout_EAX;
            }
            if ((uVar13 >> 0x10 & 1) == 0) goto LAB_005b8311;
            uVar26 = uVar13 + 1;
            goto LAB_005b82f5;
          }
          uVar15 = (0xffffU >> (0x11 - bVar25 & 0x1f)) + 0xfff8 & 0xffff;
          if ((uVar13 - uVar15 != 0 && (int)uVar15 <= (int)uVar13) &&
             ((int)uVar13 <= (int)(uVar15 + 0x10))) {
            uVar26 = (uVar13 - uVar15) + (uint)((int)bitwidth <= (int)(uVar13 - uVar15));
            goto LAB_005b82f5;
          }
          if (bVar25 != 0x10) goto LAB_005b8307;
LAB_005b8311:
          iVar18 = iVar18 + uVar13;
          iVar40 = iVar40 + iVar18;
          sVar9 = (short)iVar40;
          if (it215 == 0) {
            sVar9 = (short)iVar18;
          }
          *data = sVar9;
          data = data + (ulong)(uint)stereo + 1;
          uVar13 = len - 1;
          uVar12 = uVar12 + 1;
          bVar27 = uVar12 < uVar10;
          len = uVar11;
        } while (uVar12 != uVar10);
LAB_005b8362:
        free((void *)local_58._0_8_);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = local_58._8_8_;
        local_58 = auVar4 << 0x40;
        in_RAX = extraout_RAX;
      } while (0 < len);
    }
  }
  return (int)in_RAX;
}

Assistant:

static int decompress16(DUMBFILE *f, short *data, int len, int it215, int stereo)
{
	int blocklen, blockpos;
	byte bitwidth;
	int32 val;
	short d1, d2;
	readblock_crap crap;

	memset(&crap, 0, sizeof(crap));

	for ( blocklen = 0, blockpos = 0; blocklen < len; blocklen++, blockpos += 1 + stereo )
		data[ blockpos ] = 0;

	while (len > 0) {
		//Read a block of compressed data:
		if (readblock(f, &crap))
			return -1;
		//Set up a few variables
		blocklen = (len < 0x4000) ? len : 0x4000; // Max block length is 0x4000 bytes
		blockpos = 0;
		bitwidth = 17;
		d1 = d2 = 0;
		//Start the decompression:
		while (blockpos < blocklen) {
			val = readbits(bitwidth, &crap);
			//Check for bit width change:

			if (bitwidth < 7) { //Method 1:
				if (val == (1 << (bitwidth - 1))) {
					val = readbits(4, &crap) + 1;
					bitwidth = (byte)((val < bitwidth) ? val : val + 1);
					continue;
				}
			}
			else if (bitwidth < 17) { //Method 2
				word border = (0xFFFF >> (17 - bitwidth)) - 8;

				if (val > border && val <= (border + 16)) {
					val -= border;
					bitwidth = (byte)(val < bitwidth ? val : val + 1);
					continue;
				}
			}
			else if (bitwidth == 17) { //Method 3
				if (val & 0x10000) {
					bitwidth = (byte)((val + 1) & 0xFF);
					continue;
				}
			}
			else { //Illegal width, abort ?
				freeblock(&crap);
				return -1;
			}

			//Expand the value to signed byte:
			{
				short v; //The sample value:
				if (bitwidth < 16) {
					byte shift = 16 - bitwidth;
					v = (short)(val << shift);
					v >>= shift;
				}
				else
					v = (short)val;

				//And integrate the sample value
				//(It always has to end with integration doesn't it ? ;-)
				d1 += v;
				d2 += d1;
			}

			//Store !
			/* Version 2.15 was an unofficial version with hacked compression
			 * code. Yay, better compression :D
			 */
			*data++ = it215 ? d2 : d1;
			data += stereo;
			len--;
			blockpos++;
		}
		freeblock(&crap);
	}
	return 0;
}